

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Context.cpp
# Opt level: O2

ostream * operator<<(ostream *os,Context *context)

{
  pointer psVar1;
  ostream *poVar2;
  string *psVar3;
  __shared_ptr<Image,_(__gnu_cxx::_Lock_policy)2> *p_Var4;
  undefined1 local_60 [8];
  shared_ptr<Image> image;
  vector<std::shared_ptr<Image>,_std::allocator<std::shared_ptr<Image>_>_> local_48;
  
  std::operator<<(os,"Back projection Context Object\n");
  *(undefined8 *)(os + *(long *)(*(long *)os + -0x18) + 0x10) = 4;
  std::vector<std::shared_ptr<Image>,_std::allocator<std::shared_ptr<Image>_>_>::vector
            (&local_48,&context->Images);
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)os);
  std::operator<<(poVar2,"    images { ");
  std::vector<std::shared_ptr<Image>,_std::allocator<std::shared_ptr<Image>_>_>::~vector(&local_48);
  std::vector<std::shared_ptr<Image>,_std::allocator<std::shared_ptr<Image>_>_>::vector
            (&local_48,&context->Images);
  psVar1 = local_48.
           super__Vector_base<std::shared_ptr<Image>,_std::allocator<std::shared_ptr<Image>_>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  for (p_Var4 = &(local_48.
                  super__Vector_base<std::shared_ptr<Image>,_std::allocator<std::shared_ptr<Image>_>_>
                  ._M_impl.super__Vector_impl_data._M_start)->
                 super___shared_ptr<Image,_(__gnu_cxx::_Lock_policy)2>;
      p_Var4 != &psVar1->super___shared_ptr<Image,_(__gnu_cxx::_Lock_policy)2>; p_Var4 = p_Var4 + 1)
  {
    std::__shared_ptr<Image,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<Image,_(__gnu_cxx::_Lock_policy)2> *)local_60,p_Var4);
    psVar3 = Image::get_fileName_abi_cxx11_((Image *)local_60);
    poVar2 = std::operator<<(os,(string *)psVar3);
    std::operator<<(poVar2," ");
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&image);
  }
  std::vector<std::shared_ptr<Image>,_std::allocator<std::shared_ptr<Image>_>_>::~vector(&local_48);
  std::operator<<(os,"}\n");
  *(undefined8 *)(os + *(long *)(*(long *)os + -0x18) + 0x10) = 4;
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::vector((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
            *)&local_48,&context->Points);
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)os);
  std::operator<<(poVar2,"    points { ");
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::~vector((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             *)&local_48);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::vector((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
            *)&local_48,&context->Points);
  for (p_Var4 = &(local_48.
                  super__Vector_base<std::shared_ptr<Image>,_std::allocator<std::shared_ptr<Image>_>_>
                  ._M_impl.super__Vector_impl_data._M_start)->
                 super___shared_ptr<Image,_(__gnu_cxx::_Lock_policy)2>;
      p_Var4 != &(local_48.
                  super__Vector_base<std::shared_ptr<Image>,_std::allocator<std::shared_ptr<Image>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish)->
                 super___shared_ptr<Image,_(__gnu_cxx::_Lock_policy)2>;
      p_Var4 = (__shared_ptr<Image,_(__gnu_cxx::_Lock_policy)2> *)&p_Var4[1]._M_refcount) {
    std::vector<double,_std::allocator<double>_>::vector
              ((vector<double,_std::allocator<double>_> *)local_60,
               (vector<double,_std::allocator<double>_> *)p_Var4);
    std::operator<<(os,"{");
    poVar2 = std::ostream::_M_insert<double>(*(double *)local_60);
    std::operator<<(poVar2,",");
    poVar2 = std::ostream::_M_insert<double>
                       ((double)(((string *)((long)local_60 + 8))->_M_dataplus)._M_p);
    std::operator<<(poVar2,",");
    poVar2 = std::ostream::_M_insert<double>
                       ((double)((string *)((long)local_60 + 8))->_M_string_length);
    std::operator<<(poVar2,"} ");
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
              ((_Vector_base<double,_std::allocator<double>_> *)local_60);
  }
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::~vector((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             *)&local_48);
  std::operator<<(os,"}\n");
  *(undefined8 *)(os + *(long *)(*(long *)os + -0x18) + 0x10) = 4;
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)os);
  std::operator<<(poVar2,"    operations available.");
  return os;
}

Assistant:

std::ostream &operator<<(std::ostream &os, const Context &context)
{
    //Output the pertinent information of the context to the stream.
    os << "Back projection Context Object\n";

    os << std::setw(4) << context.listImages().size() << "    images { ";
    for (auto image : context.listImages())
    {
        os << image->get_fileName() << " ";
    }
    os << "}\n";

    os << std::setw(4) << context.listPoints().size() << "    points { ";
    for (auto point : context.listPoints())
    {
        os << "{" << point[0] << "," << point[1] << "," << point[2] << "} ";
    }
    os << "}\n";

    os << std::setw(4) << context.listOperations().size() << "    operations available.";

    return os;
}